

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

int Wlc_NtkCreateLevels(Wlc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  uVar1 = p->iObj;
  if ((p->vLevels).nCap < (int)uVar1) {
    piVar4 = (p->vLevels).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vLevels).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vLevels).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vLevels).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vLevels).nSize = uVar1;
  if (1 < p->iObj) {
    lVar6 = 1;
    lVar7 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar6) goto LAB_00369fb5;
      Wlc_NtkCreateLevels_rec(p,(Wlc_Obj_t *)(&p->pObjs->field_0x0 + lVar7));
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x18;
    } while (lVar6 < p->iObj);
  }
  if (1 < p->iObj) {
    lVar6 = 1;
    lVar7 = 7;
    do {
      if (p->nObjsAlloc <= lVar6) goto LAB_00369fb5;
      if (((*(ushort *)((long)p->pObjs + lVar7 * 4 + -4) & 0x3d) != 1) &&
         (*(int *)(&p->pObjs->field_0x0 + lVar7 * 4) != 0)) {
        if ((p->vLevels).nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar4 = (p->vLevels).pArray + lVar6;
        *piVar4 = *piVar4 + 1;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 6;
    } while (lVar6 < p->iObj);
  }
  uVar1 = (p->vLevels).nSize;
  if ((ulong)uVar1 == 0) {
    iVar3 = 0;
  }
  else {
    piVar4 = (p->vLevels).pArray;
    iVar3 = *piVar4;
    if (1 < (int)uVar1) {
      uVar5 = 1;
      do {
        iVar2 = piVar4[uVar5];
        if (iVar3 <= iVar2) {
          iVar3 = iVar2;
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  if (0 < (p->vFfs2).nSize) {
    lVar6 = 0;
    do {
      if ((p->vFfs2).nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vFfs2).pArray[lVar6];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) {
LAB_00369fb5:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vLevels).nSize <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vLevels).pArray[iVar2] = iVar3 + 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vFfs2).nSize);
  }
  return iVar3 + 1;
}

Assistant:

int Wlc_NtkCreateLevels( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;  int i, LeveMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
        Wlc_NtkCreateLevels_rec( p, pObj );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) && Wlc_ObjFaninNum(pObj) )
            Vec_IntAddToEntry( &p->vLevels, i, 1 );
    LeveMax = Vec_IntFindMax( &p->vLevels );
    Wlc_NtkForEachFf2( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, Wlc_ObjId(p, pObj), LeveMax+1 );
    //Wlc_NtkPrintObjects( p ); 
    return LeveMax+1;
}